

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O2

void duckdb::PushCollations
               (ClientContext *context,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *children,CollationType type)

{
  pointer puVar1;
  bool bVar2;
  pointer pEVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *arg;
  LogicalType *type_00;
  pointer this;
  string collation;
  LogicalType collation_type;
  string local_80;
  LogicalType local_60;
  string local_48;
  
  ExtractCollation_abi_cxx11_(&local_80,(duckdb *)children,children);
  if (local_80._M_string_length != 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      local_48.field_2._8_8_ = local_80.field_2._8_8_;
    }
    else {
      local_48._M_dataplus._M_p = local_80._M_dataplus._M_p;
    }
    local_48._M_string_length = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    LogicalType::VARCHAR_COLLATION(&local_60,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    type_00 = &(bound_function->super_BaseScalarFunction).return_type;
    bVar2 = RequiresCollationPropagation(type_00);
    if (bVar2) {
      LogicalType::operator=(type_00,&local_60);
    }
    puVar1 = (children->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = (children->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this);
      bVar2 = RequiresCollationPropagation(&pEVar3->return_type);
      if (bVar2) {
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this);
        LogicalType::operator=(&pEVar3->return_type,&local_60);
      }
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this);
      ExpressionBinder::PushCollation(context,this,&pEVar3->return_type,type);
    }
    LogicalType::~LogicalType(&local_60);
  }
  ::std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void PushCollations(ClientContext &context, ScalarFunction &bound_function, vector<unique_ptr<Expression>> &children,
                    CollationType type) {
	auto collation = ExtractCollation(children);
	if (collation.empty()) {
		// no collation to push
		return;
	}
	// push collation into the return type if required
	auto collation_type = LogicalType::VARCHAR_COLLATION(std::move(collation));
	if (RequiresCollationPropagation(bound_function.return_type)) {
		bound_function.return_type = collation_type;
	}
	// push collations to the children
	for (auto &arg : children) {
		if (RequiresCollationPropagation(arg->return_type)) {
			// if this is a varchar type - propagate the collation
			arg->return_type = collation_type;
		}
		// now push the actual collation handling
		ExpressionBinder::PushCollation(context, arg, arg->return_type, type);
	}
}